

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlreader.c
# Opt level: O2

int xmlTextReaderPushData(xmlTextReaderPtr reader)

{
  xmlTextReaderState xVar1;
  uint uVar2;
  xmlBufPtr buf;
  xmlTextReaderState xVar3;
  int iVar4;
  size_t sVar5;
  xmlChar *pxVar6;
  xmlParserCtxtPtr pxVar7;
  int size;
  
  if (reader->input == (xmlParserInputBufferPtr)0x0) {
    return -1;
  }
  buf = reader->input->buffer;
  if (buf == (xmlBufPtr)0x0) {
    return -1;
  }
  xVar1 = reader->state;
  reader->state = XML_TEXTREADER_NONE;
  xVar3 = XML_TEXTREADER_NONE;
  do {
    if (xVar3 != XML_TEXTREADER_NONE) {
LAB_0016d1dc:
      reader->state = xVar1;
      if (reader->mode == 3) {
LAB_0016d240:
        if (xVar1 != XML_TEXTREADER_DONE) {
          sVar5 = xmlBufUse(buf);
          uVar2 = reader->cur;
          pxVar7 = reader->ctxt;
          pxVar6 = xmlBufContent(buf);
          iVar4 = xmlParseChunk(pxVar7,(char *)(pxVar6 + reader->cur),(int)sVar5 - uVar2,1);
          sVar5 = xmlBufUse(buf);
          reader->cur = (uint)sVar5;
          reader->state = XML_TEXTREADER_DONE;
          if (iVar4 != 0) {
            if (reader->ctxt->wellFormed == 0) {
              return -1;
            }
            reader->ctxt->wellFormed = 0;
          }
        }
      }
      else if ((reader->mode == 1) && (0x50 < reader->cur)) {
        sVar5 = xmlBufShrink(buf,(ulong)(reader->cur - 0x50));
        if (-1 < (int)sVar5) {
          reader->cur = reader->cur - (int)sVar5;
        }
      }
      if (reader->ctxt->wellFormed == 0) {
        reader->mode = 3;
        return -1;
      }
      return 0;
    }
    sVar5 = xmlBufUse(buf);
    if (sVar5 < reader->cur + 0x200) {
      if (reader->mode == 3) {
LAB_0016d23d:
        reader->state = xVar1;
        goto LAB_0016d240;
      }
      iVar4 = xmlParserInputBufferRead(reader->input,0x1000);
      if (iVar4 == 0) {
        sVar5 = xmlBufUse(buf);
        if (sVar5 == reader->cur) {
          reader->mode = 3;
          goto LAB_0016d23d;
        }
      }
      else if (iVar4 < 0) {
        xmlCtxtErrIO(reader->ctxt,reader->input->error,(char *)0x0);
        reader->mode = 2;
        reader->state = XML_TEXTREADER_ERROR;
        return -1;
      }
    }
    sVar5 = xmlBufUse(buf);
    if (sVar5 < reader->cur + 0x200) {
      sVar5 = xmlBufUse(buf);
      size = (int)sVar5 - reader->cur;
      pxVar7 = reader->ctxt;
      pxVar6 = xmlBufContent(buf);
      iVar4 = xmlParseChunk(pxVar7,(char *)(pxVar6 + reader->cur),size,0);
      reader->cur = reader->cur + size;
      if (iVar4 != 0) {
        pxVar7 = reader->ctxt;
LAB_0016d1d8:
        pxVar7->wellFormed = 0;
      }
      goto LAB_0016d1dc;
    }
    pxVar7 = reader->ctxt;
    pxVar6 = xmlBufContent(buf);
    iVar4 = xmlParseChunk(pxVar7,(char *)(pxVar6 + reader->cur),0x200,0);
    reader->cur = reader->cur + 0x200;
    pxVar7 = reader->ctxt;
    if (iVar4 != 0) goto LAB_0016d1d8;
    if (pxVar7->wellFormed == 0) goto LAB_0016d1dc;
    xVar3 = reader->state;
  } while( true );
}

Assistant:

static int
xmlTextReaderPushData(xmlTextReaderPtr reader) {
    xmlBufPtr inbuf;
    int val, s;
    xmlTextReaderState oldstate;

    if ((reader->input == NULL) || (reader->input->buffer == NULL))
	return(-1);

    oldstate = reader->state;
    reader->state = XML_TEXTREADER_NONE;
    inbuf = reader->input->buffer;

    while (reader->state == XML_TEXTREADER_NONE) {
	if (xmlBufUse(inbuf) < reader->cur + CHUNK_SIZE) {
	    /*
	     * Refill the buffer unless we are at the end of the stream
	     */
	    if (reader->mode != XML_TEXTREADER_MODE_EOF) {
		val = xmlParserInputBufferRead(reader->input, 4096);
		if (val == 0) {
		    if (xmlBufUse(inbuf) == reader->cur) {
			reader->mode = XML_TEXTREADER_MODE_EOF;
                        break;
		    }
		} else if (val < 0) {
                    xmlCtxtErrIO(reader->ctxt, reader->input->error, NULL);
                    reader->mode = XML_TEXTREADER_MODE_ERROR;
                    reader->state = XML_TEXTREADER_ERROR;
                    return(-1);
		}

	    } else
		break;
	}
	/*
	 * parse by block of CHUNK_SIZE bytes, various tests show that
	 * it's the best tradeoff at least on a 1.2GH Duron
	 */
	if (xmlBufUse(inbuf) >= reader->cur + CHUNK_SIZE) {
	    val = xmlParseChunk(reader->ctxt,
                 (const char *) xmlBufContent(inbuf) + reader->cur,
                                CHUNK_SIZE, 0);
	    reader->cur += CHUNK_SIZE;
	    if (val != 0)
		reader->ctxt->wellFormed = 0;
	    if (reader->ctxt->wellFormed == 0)
		break;
	} else {
	    s = xmlBufUse(inbuf) - reader->cur;
	    val = xmlParseChunk(reader->ctxt,
		 (const char *) xmlBufContent(inbuf) + reader->cur,
			        s, 0);
	    reader->cur += s;
	    if (val != 0)
		reader->ctxt->wellFormed = 0;
	    break;
	}
    }
    reader->state = oldstate;

    /*
     * Discard the consumed input when needed and possible
     */
    if (reader->mode == XML_TEXTREADER_MODE_INTERACTIVE) {
        if (reader->cur > 80 /* LINE_LEN */) {
            val = xmlBufShrink(inbuf, reader->cur - 80);
            if (val >= 0) {
                reader->cur -= val;
            }
        }
    }

    /*
     * At the end of the stream signal that the work is done to the Push
     * parser.
     */
    else if (reader->mode == XML_TEXTREADER_MODE_EOF) {
	if (reader->state != XML_TEXTREADER_DONE) {
	    s = xmlBufUse(inbuf) - reader->cur;
	    val = xmlParseChunk(reader->ctxt,
		 (const char *) xmlBufContent(inbuf) + reader->cur,
			        s, 1);
	    reader->cur = xmlBufUse(inbuf);
	    reader->state  = XML_TEXTREADER_DONE;
	    if (val != 0) {
	        if (reader->ctxt->wellFormed)
		    reader->ctxt->wellFormed = 0;
		else
		    return(-1);
	    }
	}
    }
    if (reader->ctxt->wellFormed == 0) {
	reader->mode = XML_TEXTREADER_MODE_EOF;
        return(-1);
    }

    return(0);
}